

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O1

void test_send_impl(char *file,int line,int sock,char *data)

{
  uint uVar1;
  uint extraout_EAX;
  size_t sVar2;
  undefined4 in_register_00000014;
  
  sVar2 = strlen((char *)CONCAT44(in_register_00000014,sock));
  uVar1 = nn_send(line,(char *)CONCAT44(in_register_00000014,sock),sVar2,0);
  if ((int)uVar1 < 0) {
    test_send_impl_cold_1();
    uVar1 = extraout_EAX;
  }
  else if (uVar1 == (uint)sVar2) {
    return;
  }
  fprintf(_stderr,"Data to send is truncated: %d != %d (%s:%d)\n",(ulong)uVar1,sVar2 & 0xffffffff,
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device7.c",
          (ulong)file & 0xffffffff);
  nn_err_abort();
}

Assistant:

static void NN_UNUSED test_send_impl (char *file, int line,
    int sock, char *data)
{
    size_t data_len;
    int rc;

    data_len = strlen (data);

    rc = nn_send (sock, data, data_len, 0);
    if (rc < 0) {
        fprintf (stderr, "Failed to send: %s [%d] (%s:%d)\n",
            nn_err_strerror (errno),
            (int) errno, file, line);
        nn_err_abort ();
    }
    if (rc != (int)data_len) {
        fprintf (stderr, "Data to send is truncated: %d != %d (%s:%d)\n",
            rc, (int) data_len,
            file, line);
        nn_err_abort ();
    }
}